

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles3::Functional::eval_selection_ivec2(ShaderEvalContext *c)

{
  float fVar1;
  undefined8 uVar2;
  Vector<int,_2> *v;
  Vector<float,_2> local_58;
  Vector<float,_2> local_50;
  Vector<int,_2> local_48;
  Vector<int,_2> local_40;
  Vector<int,_2> local_38;
  Vector<float,_2> local_30;
  VecAccess<float,_4,_2> local_28;
  
  fVar1 = c->in[0].m_data[2];
  uVar2 = *(undefined8 *)c->in[1].m_data;
  local_50.m_data[1] = (float)uVar2;
  local_50.m_data[0] = (float)((ulong)uVar2 >> 0x20);
  tcu::Vector<float,_2>::cast<int>(&local_50);
  uVar2 = *(undefined8 *)(c->in[2].m_data + 1);
  local_58.m_data[1] = (float)uVar2;
  local_58.m_data[0] = (float)((ulong)uVar2 >> 0x20);
  tcu::Vector<float,_2>::cast<int>(&local_58);
  v = &local_48;
  if (0.0 < fVar1) {
    v = &local_40;
  }
  tcu::Vector<int,_2>::Vector(&local_38,v);
  tcu::Vector<int,_2>::cast<float>(&local_38);
  local_28.m_vector = &c->color;
  local_28.m_index[0] = 1;
  local_28.m_index[1] = 2;
  tcu::VecAccess<float,_4,_2>::operator=(&local_28,&local_30);
  return;
}

Assistant:

void eval_selection_ivec2	(ShaderEvalContext& c) { c.color.yz()	= selection(c.in[0].z() > 0.0f,			c.in[1].swizzle(1, 0).asInt(),			c.in[2].swizzle(2, 1).asInt()).asFloat(); }